

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenModulePrintAsmjs(BinaryenModuleRef module)

{
  __node_base_ptr *this;
  IString str;
  ostream *this_00;
  string_view local_8a8;
  Flags local_898;
  undefined1 local_870 [8];
  Wasm2JSGlue glue;
  string local_820;
  undefined1 local_800 [8];
  Output out;
  undefined1 local_4e8 [8];
  JSPrinter jser;
  string_view local_4a0;
  Value *local_490;
  Ref asmjs;
  Flags local_3d0;
  undefined1 local_3a8 [8];
  Wasm2JSBuilder wasm2js;
  Flags flags;
  Module *wasm;
  BinaryenModuleRef module_local;
  
  this = &wasm2js.functionsCallableFromOutside._M_h._M_single_bucket;
  ::wasm::Wasm2JSBuilder::Flags::Flags((Flags *)this);
  ::wasm::Wasm2JSBuilder::Flags::Flags(&local_3d0,(Flags *)this);
  ::wasm::PassOptions::PassOptions((PassOptions *)&asmjs,&globalPassOptions);
  ::wasm::Wasm2JSBuilder::Wasm2JSBuilder
            ((Wasm2JSBuilder *)local_3a8,&local_3d0,(PassOptions *)&asmjs);
  ::wasm::PassOptions::~PassOptions((PassOptions *)&asmjs);
  ::wasm::Wasm2JSBuilder::Flags::~Flags(&local_3d0);
  jser.ast.inst = (Value *)::wasm::ASM_FUNC._0_8_;
  str.str._M_str = (char *)::wasm::ASM_FUNC._8_8_;
  str.str._M_len = ::wasm::ASM_FUNC._0_8_;
  ::wasm::Name::Name((Name *)&local_4a0,str);
  out._776_8_ = ::wasm::Wasm2JSBuilder::processWasm
                          ((Wasm2JSBuilder *)local_3a8,module,(Name)local_4a0);
  local_490 = (Value *)out._776_8_;
  cashew::JSPrinter::JSPrinter((JSPrinter *)local_4e8,true,true,(Ref)out._776_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_820,"",
             (allocator<char> *)((long)&glue.moduleName.super_IString.str._M_str + 7));
  ::wasm::Output::Output((Output *)local_800,&local_820,Text);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&glue.moduleName.super_IString.str._M_str + 7));
  ::wasm::Wasm2JSBuilder::Flags::Flags
            (&local_898,(Flags *)&wasm2js.functionsCallableFromOutside._M_h._M_single_bucket);
  ::wasm::Name::Name((Name *)&local_8a8,"asmFunc");
  ::wasm::Wasm2JSGlue::Wasm2JSGlue
            ((Wasm2JSGlue *)local_870,module,(Output *)local_800,&local_898,(Name)local_8a8);
  ::wasm::Wasm2JSBuilder::Flags::~Flags(&local_898);
  ::wasm::Wasm2JSGlue::emitPre((Wasm2JSGlue *)local_870);
  cashew::JSPrinter::printAst((JSPrinter *)local_4e8);
  this_00 = std::operator<<((ostream *)&std::cout,(char *)jser._0_8_);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  ::wasm::Wasm2JSGlue::emitPost((Wasm2JSGlue *)local_870);
  ::wasm::Wasm2JSGlue::~Wasm2JSGlue((Wasm2JSGlue *)local_870);
  ::wasm::Output::~Output((Output *)local_800);
  cashew::JSPrinter::~JSPrinter((JSPrinter *)local_4e8);
  ::wasm::Wasm2JSBuilder::~Wasm2JSBuilder((Wasm2JSBuilder *)local_3a8);
  ::wasm::Wasm2JSBuilder::Flags::~Flags
            ((Flags *)&wasm2js.functionsCallableFromOutside._M_h._M_single_bucket);
  return;
}

Assistant:

void BinaryenModulePrintAsmjs(BinaryenModuleRef module) {
  auto* wasm = (Module*)module;
  Wasm2JSBuilder::Flags flags;
  Wasm2JSBuilder wasm2js(flags, globalPassOptions);
  auto asmjs = wasm2js.processWasm(wasm);
  JSPrinter jser(true, true, asmjs);
  Output out("", Flags::Text); // stdout
  Wasm2JSGlue glue(*wasm, out, flags, "asmFunc");
  glue.emitPre();
  jser.printAst();
  std::cout << jser.buffer << std::endl;
  glue.emitPost();
}